

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityIdentifier.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityIdentifier *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString KStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  SimulationIdentifier::GetAsString_abi_cxx11_(&KStack_1b8,&this->super_SimulationIdentifier);
  poVar1 = std::operator<<(local_188,(string *)&KStack_1b8);
  poVar1 = std::operator<<(poVar1,"Object:      ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,*(ushort *)&(this->super_SimulationIdentifier).field_0xc)
  ;
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&KStack_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

KString EntityIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << SimulationIdentifier::GetAsString()
       << "Object:      " << m_ui16EntityID << "\n";

    return ss.str();
}